

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::AppendStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,string *str)

{
  LogMessage *other;
  char *pcVar1;
  int iVar2;
  int iVar3;
  LogFinisher local_69;
  LogMessage local_68;
  
  pcVar1 = this->buffer_end_;
  if ((long)size <= (long)(pcVar1 + ((long)this->limit_ - (long)ptr))) {
    std::__cxx11::string::reserve((ulong)str);
    pcVar1 = this->buffer_end_;
  }
  iVar3 = ((int)pcVar1 - (int)ptr) + 0x10;
  while( true ) {
    iVar2 = size - iVar3;
    if (iVar2 == 0 || size < iVar3) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "src/../third_party/protobuf-lite/google/protobuf/parse_context.h",0x143);
      other = LogMessage::operator<<(&local_68,"CHECK failed: size > chunk_size: ");
      LogFinisher::operator=(&local_69,other);
      LogMessage::~LogMessage(&local_68);
    }
    if (((this->next_chunk_ == (char *)0x0) ||
        (std::__cxx11::string::append((char *)str,(ulong)ptr), this->limit_ < 0x11)) ||
       (pcVar1 = Next(this), pcVar1 == (char *)0x0)) break;
    ptr = pcVar1 + 0x10;
    iVar3 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
    size = iVar2;
    if (iVar2 <= iVar3) {
      std::__cxx11::string::append((char *)str,(ulong)ptr);
      return ptr + iVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::AppendStringFallback(const char* ptr, int size,
                                                     std::string* str) {
  if (PROTOBUF_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    // Reserve the string up to a static safe size. If strings are bigger than
    // this we proceed by growing the string as needed. This protects against
    // malicious payloads making protobuf hold on to a lot of memory.
    str->reserve(str->size() + std::min<int>(size, kSafeStringSize));
  }
  return AppendSize(ptr, size,
                    [str](const char* p, int s) { str->append(p, s); });
}